

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NewFunctionProcessingVisitor.cpp
# Opt level: O2

void __thiscall
NewFunctionProcessingVisitor::Visit
          (NewFunctionProcessingVisitor *this,AssignmentStatement *statement)

{
  Lvalue *pLVar1;
  VariableValue *this_00;
  int iVar2;
  int iVar3;
  Value *value;
  Value *pVVar4;
  ArrayValue *this_01;
  string *this_02;
  Symbol SStack_128;
  Symbol local_108;
  Symbol local_e8;
  Symbol local_c8;
  string local_a8;
  string local_88;
  string local_68;
  string local_48;
  
  value = TemplateVisitor<Value_*>::Accept
                    (&this->super_TemplateVisitor<Value_*>,&statement->expression_->super_Node);
  pLVar1 = statement->lvalue_;
  if (pLVar1->code_ == 2) {
    std::__cxx11::string::string((string *)&local_68,(string *)&pLVar1->field_access_->field_name_);
    Symbol::Symbol(&local_e8,&local_68);
    iVar2 = FunctionTable::Get(&this->table_,&local_e8);
    std::__cxx11::string::~string((string *)&local_e8);
    std::__cxx11::string::~string((string *)&local_68);
    this_00 = this->this_;
    std::__cxx11::string::string
              ((string *)&local_88,(string *)&statement->lvalue_->field_access_->field_name_);
    Symbol::Symbol(&local_108,&local_88);
    VariableValue::SetField(this_00,&local_108,value);
    std::__cxx11::string::~string((string *)&local_108);
    this_02 = &local_88;
  }
  else {
    if (pLVar1->code_ == 1) {
      std::__cxx11::string::string
                ((string *)&local_48,(string *)&pLVar1->array_access_expression_->array_indent_);
      Symbol::Symbol(&local_c8,&local_48);
      iVar2 = FunctionTable::Get(&this->table_,&local_c8);
      std::__cxx11::string::~string((string *)&local_c8);
      std::__cxx11::string::~string((string *)&local_48);
      pVVar4 = TemplateVisitor<Value_*>::Accept
                         (&this->super_TemplateVisitor<Value_*>,
                          &statement->lvalue_->array_access_expression_->index_expression_->
                           super_Node);
      iVar3 = (*pVVar4->_vptr_Value[2])(pVVar4);
      pVVar4 = FrameEmulator::Get(&this->frame_,iVar2);
      this_01 = (ArrayValue *)__dynamic_cast(pVVar4,&Value::typeinfo,&ArrayValue::typeinfo,0);
      ArrayValue::SetAtIndex(this_01,value,(long)iVar3);
      return;
    }
    std::__cxx11::string::string((string *)&local_a8,(string *)&pLVar1->variable_name_);
    Symbol::Symbol(&SStack_128,&local_a8);
    iVar2 = FunctionTable::Get(&this->table_,&SStack_128);
    std::__cxx11::string::~string((string *)&SStack_128);
    this_02 = &local_a8;
  }
  std::__cxx11::string::~string((string *)this_02);
  FrameEmulator::Set(&this->frame_,iVar2,value);
  return;
}

Assistant:

void NewFunctionProcessingVisitor::Visit(AssignmentStatement* statement) {
  auto value = Accept(statement->expression_);
  if (statement->lvalue_->code_ == Lvalue::CODE::ARR) {
    int index = table_.Get(
        Symbol(statement->lvalue_->array_access_expression_->array_indent_));
    int array_index =
        Accept(statement->lvalue_->array_access_expression_->index_expression_)
            ->GetValue();

    dynamic_cast<ArrayValue*>(frame_.Get(index))
        ->SetAtIndex(value, array_index);
  } else if (statement->lvalue_->code_ == Lvalue::CODE::FIELD) {
    int index =
        table_.Get(Symbol(statement->lvalue_->field_access_->field_name_));

    this_->SetField(Symbol(statement->lvalue_->field_access_->field_name_),
                    value);

    frame_.Set(index, value);
  } else {
    int index = table_.Get(Symbol(statement->lvalue_->variable_name_));

    frame_.Set(index, value);
  }
}